

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int detect_form(archive_read *a,int *is_form_d)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte *b;
  size_t len;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  size_t sVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  long len_00;
  byte *p;
  size_t sVar15;
  bool bVar16;
  ssize_t avail;
  ssize_t nl;
  int local_64;
  size_t local_60;
  ulong local_58;
  int local_4c;
  ulong local_48;
  int local_3c;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_60);
  if (b == (byte *)0x0) {
    iVar4 = -1;
  }
  else {
    local_58 = 0;
    local_64 = 0;
    local_4c = 0;
    sVar15 = local_60;
    local_38 = is_form_d;
LAB_0015a840:
    if (local_60 == 0) {
      local_48 = 0;
      len = 0;
    }
    else {
      len = get_line_size((char *)b,local_60,(ssize_t *)&local_48);
    }
    if ((local_48 == 0) && (len == local_60)) {
      bVar16 = false;
      do {
        sVar10 = local_60;
        uVar14 = (ulong)((int)sVar15 + 0x3ffU & 0xfffffc00);
        pvVar7 = __archive_read_ahead(a,uVar14 << (uVar14 < sVar15 + 0xa0),(ssize_t *)&local_60);
        if (pvVar7 == (void *)0x0) {
          if ((long)sVar15 < (long)local_60) {
            pvVar7 = __archive_read_ahead(a,local_60,(ssize_t *)&local_60);
            bVar16 = true;
            goto LAB_0015a8d6;
          }
          bVar2 = false;
          b = (byte *)0x0;
        }
        else {
LAB_0015a8d6:
          sVar3 = local_60;
          b = (byte *)((long)pvVar7 + (sVar15 - sVar10));
          local_60 = local_60 - (sVar15 - sVar10);
          sVar8 = get_line_size((char *)b,local_60,(ssize_t *)&local_48);
          if (sVar8 < 0) {
            len = 0;
          }
          len = len + sVar8;
          bVar2 = true;
          sVar15 = sVar3;
        }
        if (!bVar2) {
          len = 0;
          break;
        }
        if (((local_48 != 0) || (len != local_60)) || (bVar16)) break;
      } while( true );
    }
    uVar14 = local_48;
    if ((0 < (long)len) && (local_48 != 0)) {
      if (local_64 == 0) {
        bVar16 = 0 < (long)len;
        if (0 < (long)len) {
          pbVar13 = b + len;
          do {
            sVar10 = local_60 - 1;
            if ((*b != 0x20) && (*b != 9)) goto LAB_0015a998;
            b = b + 1;
            bVar16 = 1 < (long)len;
            bVar2 = 1 < (long)len;
            len = len - 1;
            local_60 = sVar10;
          } while (bVar2);
          len = 0;
          b = pbVar13;
        }
LAB_0015a998:
        bVar1 = *b;
        if (bVar1 < 0x23) {
          if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_0015a9b4:
            b = b + len;
            local_60 = local_60 - len;
            goto LAB_0015a840;
          }
LAB_0015aa6d:
          pbVar13 = b + len;
          iVar4 = 0;
          bVar2 = false;
          p = b;
          if (bVar16) {
            uVar9 = (ulong)*b;
            if (bid_entry_safe_char[uVar9] == '\0') {
              bVar2 = false;
            }
            else {
              do {
                p = p + 1;
                if (pbVar13 <= p) {
                  bVar2 = true;
                  goto LAB_0015ab19;
                }
                uVar9 = (ulong)*p;
              } while (bid_entry_safe_char[uVar9] != '\0');
              bVar2 = true;
            }
            if ((0x20 < (byte)uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) {
              bVar2 = false;
            }
          }
LAB_0015ab19:
          sVar8 = (long)pbVar13 - (long)p;
          if (bVar2) {
LAB_0015ac13:
            local_3c = iVar4;
            iVar6 = bid_keyword_list((char *)p,sVar8,0,iVar4);
            iVar4 = local_3c;
          }
          else {
            pbVar12 = pbVar13 + -local_48;
            if (((pbVar13 + -local_48 + -2 < b) || (pbVar12[-1] != 0x5c)) ||
               ((bVar1 = pbVar13[-local_48 + -2], bVar1 != 9 && (bVar1 != 0x20)))) {
              pbVar11 = pbVar12 + -1;
              bVar16 = true;
              if (pbVar11 < b) {
                uVar5 = 0;
LAB_0015ab6c:
                if ((uVar5 == 0) || (bVar16)) goto LAB_0015ac06;
                iVar4 = 0;
                bVar2 = false;
                if (*pbVar12 != 0x2f) {
                  sVar8 = len - (uVar5 + local_48);
                  bVar2 = true;
                  iVar4 = 1;
                  p = b;
                }
              }
              else {
                bVar2 = false;
                if (*pbVar11 != 0x5c) {
                  uVar5 = 0;
                  if (b <= pbVar11) {
                    bVar16 = false;
                    uVar5 = 0;
                    do {
                      bVar1 = *pbVar11;
                      if ((bVar1 == 9) || (bVar1 == 0x20)) break;
                      if (bid_entry_safe_char[bVar1] == '\0') goto LAB_0015ac06;
                      uVar5 = uVar5 + 1;
                      if (bVar1 == 0x2f) {
                        bVar16 = true;
                      }
                      pbVar11 = pbVar11 + -1;
                    } while (b <= pbVar11);
                    pbVar12 = pbVar11 + 1;
                    bVar16 = !bVar16;
                  }
                  goto LAB_0015ab6c;
                }
                iVar4 = 0;
              }
            }
            else {
LAB_0015ac06:
              iVar4 = 0;
              bVar2 = false;
            }
            iVar6 = -1;
            if (bVar2) goto LAB_0015ac13;
          }
          if (iVar6 < 0) {
LAB_0015ac65:
            bVar16 = false;
          }
          else {
            if (local_4c == 1) {
              local_4c = 1;
              if ((iVar4 == 0) && (iVar6 != 0)) goto LAB_0015ac65;
            }
            else if ((local_4c == 0) && (local_4c = 1, iVar4 == 0)) {
              local_4c = -(uint)(iVar6 != 0);
            }
            if ((iVar4 == 0) && (pbVar13[~uVar14] == 0x5c)) {
              bVar16 = true;
              local_64 = 1;
            }
            else {
              iVar4 = (int)local_58;
              local_58 = (ulong)(iVar4 + 1);
              bVar16 = iVar4 < 2;
            }
          }
          if (!bVar16) goto LAB_0015acb0;
        }
        else {
          if (bVar1 == 0x23) goto LAB_0015a9b4;
          if (bVar1 != 0x2f) goto LAB_0015aa6d;
          iVar4 = strncmp((char *)b,"/set",4);
          if (iVar4 == 0) {
            pbVar13 = b + 4;
            len_00 = len - 4;
            iVar4 = 0;
          }
          else {
            iVar4 = strncmp((char *)b,"/unset",6);
            if (iVar4 != 0) goto LAB_0015acb0;
            pbVar13 = b + 6;
            len_00 = len - 6;
            iVar4 = 1;
          }
          iVar4 = bid_keyword_list((char *)pbVar13,len_00,iVar4,0);
          if (iVar4 < 1) goto LAB_0015acb0;
          if (b[~uVar14 + len] == 0x5c) {
            local_64 = 2;
          }
        }
        b = b + len;
        local_60 = local_60 - len;
        goto LAB_0015a840;
      }
      iVar4 = bid_keyword_list((char *)b,len,0,0);
      if (iVar4 < 1) goto LAB_0015acb0;
      b = b + len;
      if ((b[~uVar14] != 0x5c) && (bVar16 = local_64 == 1, local_64 = 0, bVar16)) {
        iVar4 = (int)local_58;
        uVar5 = iVar4 + 1;
        local_58 = (ulong)uVar5;
        local_64 = 0;
        if (1 < iVar4) goto LAB_0015acb5;
      }
      local_60 = local_60 - len;
      goto LAB_0015a840;
    }
LAB_0015acb0:
    uVar5 = (uint)local_58;
LAB_0015acb5:
    if ((int)uVar5 < 3) {
      if (len != 0) {
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
    }
    iVar4 = 0x20;
    if ((local_38 != (int *)0x0) && (local_4c == 1)) {
      *local_38 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}